

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O1

int searchAll48(uint64_t **seedbuf,uint64_t *buflen,char *path,int threads,uint64_t *lowBits,
               int lowBitN,_func_int_uint64_t_void_ptr *check,void *data,char *stop)

{
  ulong uVar1;
  long __off;
  __dev_t *p_Var2;
  void *pvVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  void *__ptr;
  pthread_t *__ptr_00;
  size_t sVar8;
  ulong uVar9;
  FILE *pFVar10;
  size_t sVar11;
  uint64_t *puVar12;
  uint64_t uVar13;
  uint uVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  void *pvVar20;
  pthread_t *__newthread;
  void *pvVar21;
  int64_t lentry;
  char dpath [4096];
  stat local_10c8;
  char local_1038 [4104];
  
  uVar18 = (ulong)threads;
  __ptr = malloc(uVar18 * 0x1370);
  __ptr_00 = (pthread_t *)malloc(uVar18 * 8);
  if (path == (char *)0x0) {
    if (buflen != (uint64_t *)0x0 && seedbuf != (uint64_t **)0x0) goto LAB_00129cbb;
  }
  else {
    sVar8 = strlen(path);
    if (0xffffffffffffefff < sVar8 - 0xff8) {
      strcpy(local_1038,path);
      uVar9 = sVar8 & 0xffffffff;
      do {
        uVar9 = uVar9 - 1;
        if ((int)(uint)uVar9 < 0) goto LAB_00129cbb;
        uVar14 = (uint)uVar9 & 0x7fffffff;
      } while (local_1038[uVar14] != '/');
      local_1038[uVar14] = '\0';
      sVar8 = strlen(local_1038);
      pcVar19 = (char *)((long)local_10c8.__unused + 0x17);
      do {
        pcVar15 = pcVar19 + 1;
        pcVar19 = pcVar19 + 1;
      } while (*pcVar15 == '/');
      if (pcVar19 < local_1038 + (int)sVar8) {
        iVar7 = 0;
        pcVar15 = pcVar19;
LAB_00129c33:
        do {
          pcVar4 = pcVar19;
          pcVar19 = pcVar4 + 1;
          if (*pcVar4 != '\0') {
            if (*pcVar4 != '/') goto LAB_00129c33;
          }
          if (pcVar15 != local_1038) {
            pcVar15[-1] = '/';
          }
          *pcVar4 = '\0';
          iVar6 = stat(local_1038,&local_10c8);
          if (iVar6 == -1) {
            iVar7 = mkdir(local_1038,0x1ed);
          }
          else if ((local_10c8.st_mode & 0xf000) != 0x4000) {
            iVar7 = 1;
          }
          if ((iVar7 != 0) || (pcVar15 = pcVar19, local_1038 + (int)sVar8 <= pcVar19))
          goto LAB_00129c93;
        } while( true );
      }
LAB_00129cbb:
      if (0 < threads) {
        uVar9 = 0;
        do {
          lVar17 = uVar9 * 0x1370;
          p_Var2 = (__dev_t *)(lVar17 + (long)__ptr);
          uVar1 = uVar9 + 1;
          *(ulong *)((long)__ptr + lVar17) = (uVar9 << 0x30) / uVar18;
          *(ulong *)((long)__ptr + lVar17 + 8) = (uVar1 << 0x30) / uVar18 - 1;
          *(uint64_t **)((long)__ptr + lVar17 + 0x10) = lowBits;
          *(int *)((long)__ptr + lVar17 + 0x18) = lowBitN;
          *(undefined1 *)((long)__ptr + lVar17 + 0x1c) = 0;
          *(_func_int_uint64_t_void_ptr **)((long)__ptr + lVar17 + 0x20) = check;
          *(void **)((long)__ptr + lVar17 + 0x28) = data;
          *(char **)((long)__ptr + lVar17 + 0x30) = stop;
          if (path == (char *)0x0) {
            *(undefined1 *)(p_Var2 + 7) = 0;
            p_Var2[0x207] = 0;
          }
          else {
            pcVar19 = (char *)((long)__ptr + lVar17 + 0x38);
            snprintf(pcVar19,0x1000,"%s.part%d",path,uVar9 & 0xffffffff);
            pFVar10 = fopen(pcVar19,"a+");
            if (pFVar10 == (FILE *)0x0) goto LAB_0012a158;
            lVar16 = 0;
            bVar5 = false;
            lVar17 = 0;
            do {
              __off = lVar17 + -1;
              iVar7 = fseek(pFVar10,__off,2);
              if (((iVar7 != 0) || (iVar7 = fgetc(pFVar10), iVar7 < 1)) || (bVar5 && iVar7 == 10)) {
                iVar7 = fseek(pFVar10,lVar16 >> 0x20,2);
                if (((iVar7 == 0) && (sVar8 = fread(local_1038,-lVar17,1,pFVar10), sVar8 != 0)) &&
                   (iVar7 = __isoc99_sscanf(local_1038,"%ld",&local_10c8), iVar7 == 1)) {
                  *p_Var2 = local_10c8.st_dev;
                  *(undefined1 *)((long)p_Var2 + 0x1c) = 1;
                  printf("Continuing thread %d at seed %ld\n");
                }
                break;
              }
              bVar5 = (bool)(bVar5 | iVar7 != 10);
              lVar16 = lVar16 + -0x100000000;
              lVar17 = __off;
            } while (__off != -0x1f);
            fseek(pFVar10,0,2);
            p_Var2[0x207] = (__dev_t)pFVar10;
            if (pFVar10 == (FILE *)0x0) goto LAB_0012a158;
          }
          uVar9 = uVar1;
        } while (uVar1 != (uint)threads);
      }
      if (0 < threads) {
        uVar18 = (ulong)(uint)threads;
        __newthread = __ptr_00;
        pvVar21 = __ptr;
        do {
          pthread_create(__newthread,(pthread_attr_t *)0x0,searchAll48Thread,pvVar21);
          pvVar21 = (void *)((long)pvVar21 + 0x1370);
          __newthread = __newthread + 1;
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
      }
      if (0 < threads) {
        uVar18 = 0;
        do {
          pthread_join(__ptr_00[uVar18],(void **)0x0);
          uVar18 = uVar18 + 1;
        } while ((uint)threads != uVar18);
      }
      if ((stop == (char *)0x0) || (*stop == '\0')) {
        if (path == (char *)0x0) {
          *buflen = 0;
          if (0 < threads) {
            uVar13 = *buflen;
            uVar18 = 0;
            do {
              lVar17 = (long)__ptr + uVar18 * 0x1370 + 0x1040;
              do {
                uVar13 = uVar13 + *(long *)(lVar17 + 800);
                *buflen = uVar13;
                lVar17 = *(long *)(lVar17 + 0x328);
              } while (lVar17 != 0);
              uVar18 = uVar18 + 1;
            } while (uVar18 != (uint)threads);
          }
          puVar12 = (uint64_t *)malloc(*buflen << 3);
          *seedbuf = puVar12;
          if (puVar12 == (uint64_t *)0x0) {
            exit(1);
          }
          if (threads < 1) {
            iVar7 = 0;
          }
          else {
            uVar18 = 0;
            lVar17 = 0;
            do {
              pvVar20 = (void *)((long)__ptr + uVar18 * 0x1370 + 0x1040);
              pvVar21 = pvVar20;
              do {
                memcpy(*seedbuf + (int)lVar17,pvVar21,*(long *)((long)pvVar21 + 800) << 3);
                lVar17 = (long)(int)lVar17 + *(long *)((long)pvVar21 + 800);
                pvVar3 = *(void **)((long)pvVar21 + 0x328);
                if (pvVar21 != pvVar20) {
                  free(pvVar21);
                }
                pvVar21 = pvVar3;
              } while (pvVar3 != (void *)0x0);
              uVar18 = uVar18 + 1;
            } while (uVar18 != (uint)threads);
            iVar7 = 0;
          }
          goto LAB_0012a162;
        }
        pFVar10 = fopen(path,"w");
        if (pFVar10 == (FILE *)0x0) {
          iVar7 = 2;
        }
        else {
          if (0 < threads) {
            uVar18 = 0;
            do {
              lVar17 = uVar18 * 0x1370;
              rewind(*(FILE **)((long)__ptr + lVar17 + 0x1038));
              do {
                sVar8 = fread(local_1038,1,0x1000,*(FILE **)((long)__ptr + lVar17 + 0x1038));
                if (sVar8 == 0) {
                  fclose(*(FILE **)((long)__ptr + lVar17 + 0x1038));
                  remove((char *)((long)__ptr + lVar17 + 0x38));
                  iVar7 = 0;
                  goto LAB_0012a009;
                }
                sVar11 = fwrite(local_1038,1,sVar8,pFVar10);
              } while (sVar11 != 0);
              fclose(pFVar10);
              iVar7 = 2;
LAB_0012a009:
              if (sVar8 != 0) goto LAB_0012a14f;
              uVar18 = uVar18 + 1;
            } while (uVar18 != (uint)threads);
          }
          fclose(pFVar10);
          iVar7 = 0;
          if (buflen != (uint64_t *)0x0 && seedbuf != (uint64_t **)0x0) {
            puVar12 = loadSavedSeeds(path,buflen);
            *seedbuf = puVar12;
          }
        }
LAB_0012a14f:
        if (iVar7 == 0) goto LAB_0012a162;
        if (iVar7 != 2) {
          return iVar7;
        }
      }
    }
  }
  goto LAB_0012a158;
LAB_00129c93:
  if (iVar7 == 0) goto LAB_00129cbb;
LAB_0012a158:
  iVar7 = 1;
LAB_0012a162:
  free(__ptr_00);
  free(__ptr);
  return iVar7;
}

Assistant:

int searchAll48(
        uint64_t **         seedbuf,
        uint64_t *          buflen,
        const char *        path,
        int                 threads,
        const uint64_t *    lowBits,
        int                 lowBitN,
        int (*check)(uint64_t s48, void *data),
        void *              data,
        volatile char *     stop
        )
{
    threadinfo_t *info = (threadinfo_t*) malloc(threads* sizeof(*info));
    thread_id_t *tids = (thread_id_t*) malloc(threads* sizeof(*tids));
    int i, t;
    int err = 0;

    if (path)
    {
        size_t pathlen = strlen(path);
        char dpath[MAX_PATHLEN];

        // split path into directory and file and create missing directories
        if (pathlen + 8 >= sizeof(dpath))
            goto L_err;
        strcpy(dpath, path);

        for (i = pathlen-1; i >= 0; i--)
        {
            if (IS_DIR_SEP(dpath[i]))
            {
                dpath[i] = 0;
                if (mkdirp(dpath))
                    goto L_err;
                break;
            }
        }
    }
    else if (seedbuf == NULL || buflen == NULL)
    {
        // no file and no buffer return: no output possible
        goto L_err;
    }

    // prepare the thread info and load progress if present
    for (t = 0; t < threads; t++)
    {
        info[t].start = (t * (MASK48+1) / threads);
        info[t].end = ((t+1) * (MASK48+1) / threads - 1);
        info[t].lowBits = lowBits;
        info[t].lowBitN = lowBitN;
        info[t].skipStart = 0;
        info[t].check = check;
        info[t].data = data;
        info[t].stop = stop;

        if (path)
        {
            // progress file of this thread
            snprintf(info[t].path, sizeof(info[t].path), "%s.part%d", path, t);
            FILE *fp = fopen(info[t].path, "a+");
            if (fp == NULL)
                goto L_err;

            int c, nnl = 0;
            char buf[32];

            // find the last newline
            for (i = 1; i < 32; i++)
            {
                if (fseek(fp, -i, SEEK_END)) break;
                c = fgetc(fp);
                if (c <= 0 || (nnl && c == '\n')) break;
                nnl |= (c != '\n');
            }

            if (i < 32 && !fseek(fp, 1-i, SEEK_END) && fread(buf, i-1, 1, fp) > 0)
            {
                // read the last entry, and replace the start seed accordingly
                int64_t lentry;
                if (sscanf(buf, "%" PRId64, &lentry) == 1)
                {
                    info[t].start = lentry;
                    info[t].skipStart = 1;
                    printf("Continuing thread %d at seed %" PRId64 "\n",
                        t, lentry);
                }
            }

            fseek(fp, 0, SEEK_END);
            info[t].fp = fp;
        }
        else
        {
            info[t].path[0] = 0;
            info[t].fp = NULL;
        }
    }


    // run the threads
#ifdef USE_PTHREAD

    for (t = 0; t < threads; t++)
    {
        pthread_create(&tids[t], NULL, searchAll48Thread, (void*)&info[t]);
    }

    for (t = 0; t < threads; t++)
    {
        pthread_join(tids[t], NULL);
    }

#else

    for (t = 0; t < threads; t++)
    {
        tids[t] = CreateThread(NULL, 0, searchAll48Thread,
            (LPVOID)&info[t], 0, NULL);
    }

    WaitForMultipleObjects(threads, tids, TRUE, INFINITE);

#endif

    if (stop && *stop)
        goto L_err;

    if (path)
    {
        // merge partial files
        FILE *fp = fopen(path, "w");
        if (fp == NULL)
            goto L_err;

        for (t = 0; t < threads; t++)
        {
            rewind(info[t].fp);

            char buffer[4097];
            size_t n;
            while ((n = fread(buffer, sizeof(char), 4096, info[t].fp)))
            {
                if (!fwrite(buffer, sizeof(char), n, fp))
                {
                    fclose(fp);
                    goto L_err;
                }
            }

            fclose(info[t].fp);
            remove(info[t].path);
        }

        fclose(fp);

        if (seedbuf && buflen)
        {
            *seedbuf = loadSavedSeeds(path, buflen);
        }
    }
    else
    {
        // merge linked seed buffers
        *buflen = 0;

        for (t = 0; t < threads; t++)
        {
            linked_seeds_t *lp = &info[t].ls;
            do
            {
                *buflen += lp->len;
                lp = lp->next;
            }
            while (lp);
        }

        *seedbuf = (uint64_t*) malloc((*buflen) * sizeof(uint64_t));
        if (*seedbuf == NULL)
            exit(1);

        i = 0;
        for (t = 0; t < threads; t++)
        {
            linked_seeds_t *lp = &info[t].ls;
            do
            {
                memcpy(*seedbuf + i, lp->seeds, lp->len * sizeof(uint64_t));
                i += lp->len;
                linked_seeds_t *tmp = lp;
                lp = lp->next;
                if (tmp != &info[t].ls)
                    free(tmp);
            }
            while (lp);
        }
    }

    if (0)
L_err:
        err = 1;

    free(tids);
    free(info);

    return err;
}